

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.c
# Opt level: O0

int symbol_add_variable(lgx_ast_t *ast,lgx_ast_node_t *node)

{
  int iVar1;
  lgx_symbol_t *local_40;
  lgx_symbol_t *symbol;
  int ret;
  uint uStack_2c;
  uchar is_global;
  lgx_str_t name;
  lgx_ast_node_t *node_local;
  lgx_ast_t *ast_local;
  
  name.buffer = (char *)node;
  if (node->children < 2) {
    __assert_fail("node->children >= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                  ,0x128,"int symbol_add_variable(lgx_ast_t *, lgx_ast_node_t *)");
  }
  if (*(char *)*node->child == '#') {
    if (*(char *)node->child[1] != '\"') {
      __assert_fail("node->child[1]->type == TYPE_EXPRESSION",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                    ,0x12a,"int symbol_add_variable(lgx_ast_t *, lgx_ast_node_t *)");
    }
    name._0_8_ = (ast->lex).source.content + (*node->child)->offset;
    uStack_2c = (*node->child)->length;
    ret = 0;
    symbol._7_1_ = '\0';
    if (((node->parent != (lgx_ast_node_s *)0x0) && (*(char *)node->parent == '\x01')) &&
       (node->parent->parent == (lgx_ast_node_s *)0x0)) {
      symbol._7_1_ = '\x01';
    }
    symbol._0_4_ = 0;
    local_40 = (lgx_symbol_t *)0x0;
    switch(*(undefined1 *)node->parent) {
    case 1:
      local_40 = symbol_add(ast,node,(node->parent->u).symbols,S_VARIABLE,(lgx_str_t *)&ret,
                            symbol._7_1_);
      break;
    default:
      symbol_error(ast,node,"[invalid variable declaration] %.*s\n",(ulong)uStack_2c,name._0_8_);
      symbol._0_4_ = 1;
      break;
    case 4:
      break;
    case 0x1b:
      if ((node->parent->parent == (lgx_ast_node_s *)0x0) ||
         (*(char *)node->parent->parent != '\x18')) {
        __assert_fail("node->parent->parent && node->parent->parent->type == FUNCTION_DECLARATION",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                      ,0x14f,"int symbol_add_variable(lgx_ast_t *, lgx_ast_node_t *)");
      }
      local_40 = symbol_add(ast,node,(node->parent->parent->child[4]->u).symbols,S_VARIABLE,
                            (lgx_str_t *)&ret,symbol._7_1_);
      break;
    case 0x1c:
      if (*node->parent->child == node) {
        if ((node->parent->parent == (lgx_ast_node_s *)0x0) ||
           (*(char *)node->parent->parent != '\x0f')) {
          __assert_fail("node->parent->parent && node->parent->parent->type == CATCH_STATEMENT",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                        ,0x15c,"int symbol_add_variable(lgx_ast_t *, lgx_ast_node_t *)");
        }
        local_40 = symbol_add(ast,node,(node->parent->parent->child[1]->u).symbols,S_VARIABLE,
                              (lgx_str_t *)&ret,symbol._7_1_);
      }
      else {
        symbol_error(ast,node,"too many paramters\n");
        symbol._0_4_ = 1;
      }
    }
    if (local_40 == (lgx_symbol_t *)0x0) {
      ast_local._4_4_ = 1;
    }
    else {
      iVar1 = symbol_parse_type(ast,*(lgx_ast_node_t **)(*(long *)(name.buffer + 0x18) + 8),
                                &local_40->type);
      if (iVar1 == 0) {
        if (((local_40->type).type == T_UNKNOWN) ||
           (iVar1 = lgx_type_is_definite(&local_40->type), iVar1 != 0)) {
          ast_local._4_4_ = (int)symbol;
        }
        else {
          symbol_error(ast,(lgx_ast_node_t *)name.buffer,"variable %.*s has incomplete type\n",
                       (ulong)uStack_2c,name._0_8_);
          ast_local._4_4_ = 1;
        }
      }
      else {
        ast_local._4_4_ = 1;
      }
    }
    return ast_local._4_4_;
  }
  __assert_fail("node->child[0]->type == IDENTIFIER_TOKEN",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fcten[P]xscript/src/parser/symbol.c"
                ,0x129,"int symbol_add_variable(lgx_ast_t *, lgx_ast_node_t *)");
}

Assistant:

static int symbol_add_variable(lgx_ast_t* ast, lgx_ast_node_t* node) {
    assert(node->children >= 2);
    assert(node->child[0]->type == IDENTIFIER_TOKEN);
    assert(node->child[1]->type == TYPE_EXPRESSION);

    // 变量名称标识符
    lgx_str_t name;
    name.buffer = ast->lex.source.content + node->child[0]->offset;
    name.length = node->child[0]->length;
    name.size = 0;

    // 是否全局变量
    unsigned char is_global = 0;
    if (node->parent && node->parent->type == BLOCK_STATEMENT && node->parent->parent == NULL) {
        is_global = 1;
    }

    int ret = 0;
    lgx_symbol_t* symbol = NULL;

    switch (node->parent->type) {
        case BLOCK_STATEMENT: { // 在块作用域内定义变量
            // 添加变量到该块作用域中
            symbol = symbol_add(ast, node,
                node->parent->u.symbols, S_VARIABLE,
                &name, is_global);
            break;
        }
        case FOR_STATEMENT: { // 在 for 循环条件中定义变量
            // TODO 必须是第一个循环条件
            if (0) {
                symbol_error(ast, node, "[invalid variable declaration] %.*s\n", name.length, name.buffer);
                ret = 1;
            } else {
                // TODO 添加变量到该 FOR 循环的块作用域中
            }
            break;
        }
        case FUNCTION_DECL_PARAMETER: { // 在函数参数列表中定义变量
            // 添加变量到该函数的块作用域中
            assert(node->parent->parent && node->parent->parent->type == FUNCTION_DECLARATION);
            symbol = symbol_add(ast, node,
                node->parent->parent->child[4]->u.symbols, S_VARIABLE,
                &name, is_global);
            break;
        }
        case EXCEPTION_DECL_PARAMETER: { // 在 catch block 参数列表中定义变量
            // 在 catch block 参数列表中只能定义一个变量
            if (node->parent->child[0] != node) {
                symbol_error(ast, node, "too many paramters\n");
                ret = 1;
            } else {
                // 添加变量到该异常处理的块作用域中
                assert(node->parent->parent && node->parent->parent->type == CATCH_STATEMENT);
                symbol = symbol_add(ast, node,
                    node->parent->parent->child[1]->u.symbols, S_VARIABLE,
                    &name, is_global);
            }
            break;
        }
        default:
            symbol_error(ast, node, "[invalid variable declaration] %.*s\n", name.length, name.buffer);
            ret = 1;
    }

    if (!symbol) {
        return 1;
    }

    if (symbol_parse_type(ast, node->child[1], &symbol->type)) {
        return 1;
    }

    if (symbol->type.type != T_UNKNOWN && !lgx_type_is_definite(&symbol->type)) {
        symbol_error(ast, node, "variable %.*s has incomplete type\n", name.length, name.buffer);
        return 1;
    }

    // 这里解析完毕后，类型可能为未知，需要在编译阶段进行类型推断

    return ret;
}